

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal.c
# Opt level: O0

size_t Qiniu_Eq_Fwrite(void *buf,size_t unused,size_t n,Qiniu_Eq *self)

{
  int iVar1;
  Qiniu_Eq *self_local;
  size_t n_local;
  size_t unused_local;
  void *buf_local;
  
  if (self->result != 0) {
    iVar1 = Qiniu_StartWith(self->v,buf,n);
    self->result = iVar1;
  }
  return n;
}

Assistant:

size_t Qiniu_Eq_Fwrite(const void *buf, size_t unused, size_t n, Qiniu_Eq *self)
{
	if (self->result)
	{
		self->result = Qiniu_StartWith(self->v, buf, n);
	}
	return n;
}